

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,float *fdtbl,int DC,
              unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  int val;
  int *bitCntP;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  float *d7p;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  unsigned_short bits [2];
  unsigned_short local_150 [2];
  unsigned_short local_14c [2];
  int *local_148;
  ulong local_140;
  int DU [64];
  
  local_14c = *HTAC;
  local_150 = HTAC[0xf0];
  d7p = CDU + 7;
  for (uVar6 = 0; uVar6 < 0x40; uVar6 = uVar6 + 8) {
    stbiw__jpg_DCT(d7p + -7,d7p + -6,d7p + -5,d7p + -4,d7p + -3,d7p + -2,d7p + -1,d7p);
    d7p = d7p + 8;
  }
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 4) {
    stbiw__jpg_DCT((float *)((long)CDU + lVar4),(float *)((long)CDU + lVar4 + 0x20),
                   (float *)((long)CDU + lVar4 + 0x40),(float *)((long)CDU + lVar4 + 0x60),
                   (float *)((long)CDU + lVar4 + 0x80),(float *)((long)CDU + lVar4 + 0xa0),
                   (float *)((long)CDU + lVar4 + 0xc0),(float *)((long)CDU + lVar4 + 0xe0));
  }
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
    DU[""[lVar4]] =
         (int)(CDU[lVar4] * fdtbl[lVar4] +
              *(float *)(&DAT_001a4700 + (ulong)(CDU[lVar4] * fdtbl[lVar4] < 0.0) * 4));
  }
  if (DU[0] - DC != 0) {
    stbiw__jpg_calcBits(DU[0] - DC,bits);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTDC[bits[1]]);
    HTDC = &bits;
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,*HTDC);
  iVar2 = 0;
  uVar6 = 0x3f;
  while( true ) {
    if ((int)uVar6 == 0) goto LAB_00157162;
    if (DU[uVar6 & 0xffffffff] != 0) break;
    iVar2 = iVar2 + 1;
    uVar6 = uVar6 - 1;
  }
  uVar1 = 1;
  local_148 = bitCnt;
  while (bitCntP = local_148, (int)uVar1 <= (int)uVar6) {
    lVar4 = (long)(int)uVar1;
    uVar3 = 0xffffffff;
    uVar7 = 0;
    do {
      uVar5 = uVar7;
      val = DU[lVar4];
      uVar3 = uVar3 + 1;
      if ((long)uVar6 < lVar4) break;
      lVar4 = lVar4 + 1;
      uVar7 = uVar5 + 1;
    } while (val == 0);
    uVar7 = uVar3;
    local_140 = uVar1;
    if (0xf < (int)uVar3) {
      uVar5 = uVar5 >> 4;
      while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
        stbiw__jpg_writeBits(s,bitBuf,bitCntP,local_150);
      }
      uVar7 = uVar3 & 0xf;
    }
    stbiw__jpg_calcBits(val,bits);
    bitCnt = local_148;
    stbiw__jpg_writeBits(s,bitBuf,local_148,HTAC[(long)(int)(uVar7 << 4) + (ulong)bits[1]]);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,bits);
    uVar1 = (ulong)((int)local_140 + uVar3 + 1);
  }
  if (iVar2 != 0) {
LAB_00157162:
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,local_14c);
  }
  return DU[0];
}

Assistant:

static int stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, float *fdtbl, int DC, const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
   const unsigned short EOB[2] = { HTAC[0x00][0], HTAC[0x00][1] };
   const unsigned short M16zeroes[2] = { HTAC[0xF0][0], HTAC[0xF0][1] };
   int dataOff, i, diff, end0pos;
   int DU[64];

   // DCT rows
   for(dataOff=0; dataOff<64; dataOff+=8) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+1], &CDU[dataOff+2], &CDU[dataOff+3], &CDU[dataOff+4], &CDU[dataOff+5], &CDU[dataOff+6], &CDU[dataOff+7]);
   }
   // DCT columns
   for(dataOff=0; dataOff<8; ++dataOff) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+8], &CDU[dataOff+16], &CDU[dataOff+24], &CDU[dataOff+32], &CDU[dataOff+40], &CDU[dataOff+48], &CDU[dataOff+56]);
   }
   // Quantize/descale/zigzag the coefficients
   for(i=0; i<64; ++i) {
      float v = CDU[i]*fdtbl[i];
      // DU[stbiw__jpg_ZigZag[i]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
      // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
      DU[stbiw__jpg_ZigZag[i]] = (int)(v < 0 ? v - 0.5f : v + 0.5f);
   }

   // Encode DC
   diff = DU[0] - DC;
   if (diff == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
   } else {
      unsigned short bits[2];
      stbiw__jpg_calcBits(diff, bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   // Encode ACs
   end0pos = 63;
   for(; (end0pos>0)&&(DU[end0pos]==0); --end0pos) {
   }
   // end0pos = first element in reverse order !=0
   if(end0pos == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
      return DU[0];
   }
   for(i = 1; i <= end0pos; ++i) {
      int startpos = i;
      int nrzeroes;
      unsigned short bits[2];
      for (; DU[i]==0 && i<=end0pos; ++i) {
      }
      nrzeroes = i-startpos;
      if ( nrzeroes >= 16 ) {
         int lng = nrzeroes>>4;
         int nrmarker;
         for (nrmarker=1; nrmarker <= lng; ++nrmarker)
            stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
         nrzeroes &= 15;
      }
      stbiw__jpg_calcBits(DU[i], bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes<<4)+bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   if(end0pos != 63) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
   }
   return DU[0];
}